

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# List.hpp
# Opt level: O0

void Lib::List<Inferences::ALASCA::FourierMotzkinConf::Lhs>::push
               (Lhs *elem,List<Inferences::ALASCA::FourierMotzkinConf::Lhs> **lst)

{
  Clause *pCVar1;
  Lhs *in_RSI;
  SelectedSummand *in_stack_ffffffffffffff68;
  SelectedSummand *in_stack_ffffffffffffff70;
  List<Inferences::ALASCA::FourierMotzkinConf::Lhs> *in_stack_ffffffffffffffe8;
  
  Kernel::SelectedSummand::SelectedSummand(in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  Inferences::ALASCA::FourierMotzkinConf::Lhs::Lhs
            ((Lhs *)in_stack_ffffffffffffff70,in_stack_ffffffffffffff68);
  pCVar1 = (Clause *)cons(in_RSI,in_stack_ffffffffffffffe8);
  (in_RSI->super_SelectedSummand).super_SelectedLiteral.cl = pCVar1;
  Inferences::ALASCA::FourierMotzkinConf::Lhs::~Lhs((Lhs *)0x3e0db3);
  Kernel::SelectedSummand::~SelectedSummand((SelectedSummand *)0x3e0dbd);
  return;
}

Assistant:

static void push(C elem,List* &lst)
  {
    lst = cons(elem, lst);
  }